

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disasm_distorm.c
# Opt level: O0

void funchook_disasm_x86_rip_relative
               (funchook_disasm_t *disasm,funchook_insn_t *insn,rip_relative_t *rel_disp,
               rip_relative_t *rel_imm)

{
  undefined1 *puVar1;
  short sVar2;
  long *in_RCX;
  long *in_RDX;
  long *in_RSI;
  undefined8 *in_RDI;
  bool bVar3;
  _Operand *op;
  int i;
  int imm_offset;
  int disp_offset;
  int opsiz;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  
  local_24 = 0;
  local_28 = 0;
  local_2c = 0;
  memset(in_RDX,0,0x18);
  memset(in_RCX,0,0x18);
  local_30 = 0;
  while( true ) {
    bVar3 = false;
    if (local_30 < 4) {
      bVar3 = *(char *)((long)in_RSI + (long)local_30 * 4 + 0x22) != '\0';
    }
    if (!bVar3) break;
    puVar1 = (undefined1 *)((long)in_RSI + (long)local_30 * 4 + 0x22);
    switch(*puVar1) {
    case 2:
      local_24 = *(ushort *)(puVar1 + 2) / 8 + local_24;
      break;
    case 5:
    case 7:
      local_24 = *(byte *)((long)in_RSI + 0x37) / 8 + local_24;
      break;
    case 6:
      if ((*(char *)((long)in_RSI + 0x37) != '\0') && (puVar1[1] == 'J')) {
        *in_RDX = in_RSI[2] + (ulong)*(byte *)((long)in_RSI + 0x33) + in_RSI[1];
        in_RDX[1] = in_RSI[1];
        *(uint *)((long)in_RDX + 0x14) = (uint)*(byte *)((long)in_RSI + 0x37);
        local_28 = local_24;
      }
      local_24 = *(byte *)((long)in_RSI + 0x37) / 8 + local_24;
      break;
    case 8:
      *in_RCX = in_RSI[2] + (ulong)*(byte *)((long)in_RSI + 0x33) + *in_RSI;
      in_RCX[1] = *in_RSI;
      *(uint *)((long)in_RCX + 0x14) = (uint)*(ushort *)(puVar1 + 2);
      local_2c = local_24;
      local_24 = *(ushort *)(puVar1 + 2) / 8 + local_24;
    }
    local_30 = local_30 + 1;
  }
  sVar2 = (short)in_RSI[4];
  if ((((((((sVar2 == 0x77b) || (sVar2 == 0x782)) || (sVar2 == 0x789)) ||
         (((sVar2 == 0x790 || (sVar2 == 0x797)) ||
          ((sVar2 == 0x82c || ((sVar2 == 0x1128 || (sVar2 == 0x1131)))))))) ||
        ((sVar2 == 0x113a ||
         (((((((sVar2 == 0x1143 || (sVar2 == 0x114f)) || (sVar2 == 0x1159)) ||
             ((sVar2 == 0x1163 || (sVar2 == 0x116d)))) || (sVar2 == 0x1177)) ||
           ((sVar2 == 0x1180 || (sVar2 == 0x1189)))) ||
          ((sVar2 == 0x1192 || (((sVar2 == 0x119e || (sVar2 == 0x11a8)) || (sVar2 == 0x11b2)))))))))
        ) || ((((((((sVar2 == 0x11bc || (sVar2 == 0x11c6)) || (sVar2 == 0x11cf)) ||
                  (((((sVar2 == 0x11d8 || (sVar2 == 0x11e1)) ||
                     ((sVar2 == 0x11ed ||
                      (((sVar2 == 0x11f7 || (sVar2 == 0x1201)) || (sVar2 == 0x120b)))))) ||
                    ((sVar2 == 0x1215 || (sVar2 == 0x121e)))) || (sVar2 == 0x1227)))) ||
                 ((((sVar2 == 0x1230 || (sVar2 == 0x123c)) ||
                   ((sVar2 == 0x1246 ||
                    ((((sVar2 == 0x1250 || (sVar2 == 0x125a)) || (sVar2 == 0x1264)) ||
                     ((sVar2 == 0x126e || (sVar2 == 0x1278)))))))) ||
                  ((sVar2 == 0x1282 || ((sVar2 == 0x128f || (sVar2 == 0x129a)))))))) ||
                ((sVar2 == 0x12a5 || (((sVar2 == 0x12b0 || (sVar2 == 0x12bb)) || (sVar2 == 0x12c8)))
                 ))) || (((sVar2 == 0x12d3 || (sVar2 == 0x12de)) || (sVar2 == 0x12eb)))) ||
              (((sVar2 == 0x12f9 || (sVar2 == 0x1303)) ||
               (((((sVar2 == 0x130d ||
                   (((sVar2 == 0x1319 || (sVar2 == 0x1326)) || (sVar2 == 0x1333)))) ||
                  ((sVar2 == 0x1340 || (sVar2 == 0x134f)))) || (sVar2 == 0x135d)) ||
                ((((sVar2 == 0x136b || (sVar2 == 0x1379)) ||
                  ((sVar2 == 0x1386 ||
                   ((((sVar2 == 0x1393 || (sVar2 == 0x13a1)) || (sVar2 == 0x13af)) ||
                    ((sVar2 == 0x13bf || (sVar2 == 0x13cd)))))))) || (sVar2 == 0x13da)))))))))) ||
      ((((((sVar2 == 0x13e7 || (sVar2 == 0x13f6)) ||
          (((sVar2 == 0x1400 || (((sVar2 == 0x140a || (sVar2 == 0x1414)) || (sVar2 == 0x1421)))) ||
           (((sVar2 == 0x142c || (sVar2 == 0x1437)) || (sVar2 == 0x1442)))))) ||
         ((((sVar2 == 0x144d || (sVar2 == 0x145a)) ||
           ((sVar2 == 0x1465 || (((sVar2 == 0x1470 || (sVar2 == 0x147d)) || (sVar2 == 0x148b))))))
          || (((sVar2 == 0x1495 || (sVar2 == 0x149f)) ||
              (((sVar2 == 0x14ab ||
                (((sVar2 == 0x14b8 || (sVar2 == 0x14c5)) ||
                 ((sVar2 == 0x14d2 ||
                  (((((sVar2 == 0x14e1 || (sVar2 == 0x14ef)) || (sVar2 == 0x14fd)) ||
                    ((sVar2 == 0x150b || (sVar2 == 0x1518)))) || (sVar2 == 0x1525)))))))) ||
               (((sVar2 == 0x1533 || (sVar2 == 0x1541)) || (sVar2 == 0x1551)))))))))) ||
        ((((((sVar2 == 0x155f || (sVar2 == 0x156c)) || (sVar2 == 0x1579)) ||
           ((((sVar2 == 0x1588 || (sVar2 == 0x1592)) ||
             ((sVar2 == 0x159c || ((sVar2 == 0x15a6 || (sVar2 == 0x15b3)))))) || (sVar2 == 0x15be)))
           ) || ((((((((sVar2 == 0x15c9 || (sVar2 == 0x15d4)) || (sVar2 == 0x15df)) ||
                     ((sVar2 == 0x15ec || (sVar2 == 0x15f7)))) ||
                    (((sVar2 == 0x1602 || ((sVar2 == 0x160f || (sVar2 == 0x161d)))) ||
                     (sVar2 == 0x1627)))) ||
                   ((((((sVar2 == 0x1631 || (sVar2 == 0x163d)) || (sVar2 == 0x164a)) ||
                      ((sVar2 == 0x1657 || (sVar2 == 0x1664)))) ||
                     ((sVar2 == 0x1673 || ((sVar2 == 0x1681 || (sVar2 == 0x168f)))))) ||
                    (sVar2 == 0x169d)))) ||
                  (((sVar2 == 0x16aa || (sVar2 == 0x16b7)) || (sVar2 == 0x16c5)))) ||
                 ((((sVar2 == 0x16d3 || (sVar2 == 0x16e3)) ||
                   ((sVar2 == 0x16f1 || ((sVar2 == 0x16fe || (sVar2 == 0x171a)))))) ||
                  ((sVar2 == 0x1724 ||
                   (((sVar2 == 0x172e || (sVar2 == 0x1738)) || (sVar2 == 0x1745)))))))))) ||
         ((sVar2 == 0x1750 || (sVar2 == 0x175b)))))) ||
       ((((sVar2 == 0x1766 || ((sVar2 == 0x1771 || (sVar2 == 0x177e)))) ||
         ((sVar2 == 0x1789 ||
          ((((((sVar2 == 0x1794 || (sVar2 == 0x17a1)) || (sVar2 == 0x17af)) ||
             ((sVar2 == 0x17b9 || (sVar2 == 0x17c3)))) ||
            ((sVar2 == 0x17cf || ((sVar2 == 0x17dc || (sVar2 == 0x17e9)))))) ||
           ((sVar2 == 0x17f6 ||
            ((((sVar2 == 0x1805 || (sVar2 == 0x1813)) || (sVar2 == 0x1821)) ||
             (((sVar2 == 0x182f || (sVar2 == 0x183c)) ||
              ((sVar2 == 0x1849 || ((sVar2 == 0x1857 || (sVar2 == 0x1865)))))))))))))))) ||
        (sVar2 == 0x1875)))))) || (((sVar2 == 0x1883 || (sVar2 == 0x1890)) || (sVar2 == 0x25f2)))) {
    local_24 = local_24 + 1;
  }
  if (0 < *(int *)((long)in_RDX + 0x14)) {
    *(uint *)(in_RDX + 2) = ((uint)*(byte *)((long)in_RSI + 0x33) - local_24) + local_28;
    funchook_log((funchook_t *)*in_RDI,
                 "      ip-relative %08x, absolute address= %016lx, offset=%d, size=%d\n",
                 in_RDX[1] & 0xffffffff,*in_RDX,(ulong)*(uint *)(in_RDX + 2),
                 (ulong)*(uint *)((long)in_RDX + 0x14));
  }
  if (0 < *(int *)((long)in_RCX + 0x14)) {
    *(uint *)(in_RCX + 2) = ((uint)*(byte *)((long)in_RSI + 0x33) - local_24) + local_2c;
    funchook_log((funchook_t *)*in_RDI,
                 "      ip-relative %08x, absolute address= %016lx, offset=%d, size=%d\n",
                 in_RCX[1] & 0xffffffff,*in_RCX,(ulong)*(uint *)(in_RCX + 2),
                 (ulong)*(uint *)((long)in_RCX + 0x14));
  }
  return;
}

Assistant:

void funchook_disasm_x86_rip_relative(funchook_disasm_t *disasm, const funchook_insn_t *insn, rip_relative_t *rel_disp, rip_relative_t *rel_imm)
{
    int opsiz = 0;
    int disp_offset = 0;
    int imm_offset = 0;
    int i;

    memset(rel_disp, 0, sizeof(rip_relative_t));
    memset(rel_imm, 0, sizeof(rip_relative_t));

    /*
     * Estimate total operand size and RIP-relative address offsets.
     */
    for (i = 0; i < OPERANDS_NO && insn->ops[i].type != O_NONE; i++) {
        const _Operand *op = &insn->ops[i];
        switch (op->type) {
        case O_IMM:
            opsiz += op->size / 8;
            break;
        case O_PC:
            rel_imm->addr = (uint8_t*)(size_t)(insn->addr + insn->size + insn->imm.addr);
            rel_imm->raddr = (intptr_t)insn->imm.addr;
            rel_imm->size = op->size;
            imm_offset = opsiz;
            opsiz += op->size / 8;
            break;
        case O_SMEM:
            if (insn->dispSize != 0 && op->index == R_RIP) {
                rel_disp->addr = (uint8_t*)(size_t)(insn->addr + insn->size + insn->disp);
                rel_disp->raddr = (intptr_t)insn->disp;
                rel_disp->size = insn->dispSize;
                disp_offset = opsiz;
            }
            opsiz += insn->dispSize / 8;
            break;
        case O_MEM:
        case O_DISP:
            opsiz += insn->dispSize / 8;
            break;
        }
    }
    switch (insn->opcode) {
    /* CMPSD */
    case I_CMPEQSD:
    case I_CMPLTSD:
    case I_CMPLESD:
    case I_CMPUNORDSD:
    case I_CMPNEQSD:
    case I_CMPNLTSD:
    case I_CMPNLESD:
    case I_CMPORDSD:
    case I_VCMPEQSD:
    case I_VCMPLTSD:
    case I_VCMPLESD:
    case I_VCMPUNORDSD:
    case I_VCMPNEQSD:
    case I_VCMPNLTSD:
    case I_VCMPNLESD:
    case I_VCMPORDSD:
    case I_VCMPEQ_UQSD:
    case I_VCMPNGESD:
    case I_VCMPNGTSD:
    case I_VCMPFALSESD:
    case I_VCMPNEQ_OQSD:
    case I_VCMPGESD:
    case I_VCMPGTSD:
    case I_VCMPTRUESD:
    case I_VCMPEQ_OSSD:
    case I_VCMPLT_OQSD:
    case I_VCMPLE_OQSD:
    case I_VCMPUNORD_SSD:
    case I_VCMPNEQ_USSD:
    case I_VCMPNLT_UQSD:
    case I_VCMPNLE_UQSD:
    case I_VCMPORD_SSD:
    case I_VCMPEQ_USSD:
    case I_VCMPNGE_UQSD:
    case I_VCMPNGT_UQSD:
    case I_VCMPFALSE_OSSD:
    case I_VCMPNEQ_OSSD:
    case I_VCMPGE_OQSD:
    case I_VCMPGT_OQSD:
    /* CMPSS */
    case I_CMPEQSS:
    case I_CMPLTSS:
    case I_CMPLESS:
    case I_CMPUNORDSS:
    case I_CMPNEQSS:
    case I_CMPNLTSS:
    case I_CMPNLESS:
    case I_CMPORDSS:
    case I_VCMPEQSS:
    case I_VCMPLTSS:
    case I_VCMPLESS:
    case I_VCMPUNORDSS:
    case I_VCMPNEQSS:
    case I_VCMPNLTSS:
    case I_VCMPNLESS:
    case I_VCMPORDSS:
    case I_VCMPEQ_UQSS:
    case I_VCMPNGESS:
    case I_VCMPNGTSS:
    case I_VCMPFALSESS:
    case I_VCMPNEQ_OQSS:
    case I_VCMPGESS:
    case I_VCMPGTSS:
    case I_VCMPTRUESS:
    case I_VCMPEQ_OSSS:
    case I_VCMPLT_OQSS:
    case I_VCMPLE_OQSS:
    case I_VCMPUNORD_SSS:
    case I_VCMPNEQ_USSS:
    case I_VCMPNLT_UQSS:
    case I_VCMPNLE_UQSS:
    case I_VCMPORD_SSS:
    case I_VCMPEQ_USSS:
    case I_VCMPNGE_UQSS:
    case I_VCMPNGT_UQSS:
    case I_VCMPFALSE_OSSS:
    case I_VCMPNEQ_OSSS:
    case I_VCMPGE_OQSS:
    case I_VCMPGT_OQSS:
    /* CMPPD */
    case I_CMPEQPD:
    case I_CMPLTPD:
    case I_CMPLEPD:
    case I_CMPUNORDPD:
    case I_CMPNEQPD:
    case I_CMPNLTPD:
    case I_CMPNLEPD:
    case I_CMPORDPD:
    case I_VCMPEQPD:
    case I_VCMPLTPD:
    case I_VCMPLEPD:
    case I_VCMPUNORDPD:
    case I_VCMPNEQPD:
    case I_VCMPNLTPD:
    case I_VCMPNLEPD:
    case I_VCMPORDPD:
    case I_VCMPEQ_UQPD:
    case I_VCMPNGEPD:
    case I_VCMPNGTPD:
    case I_VCMPFALSEPD:
    case I_VCMPNEQ_OQPD:
    case I_VCMPGEPD:
    case I_VCMPGTPD:
    case I_VCMPTRUEPD:
    case I_VCMPEQ_OSPD:
    case I_VCMPLT_OQPD:
    case I_VCMPLE_OQPD:
    case I_VCMPUNORD_SPD:
    case I_VCMPNEQ_USPD:
    case I_VCMPNLT_UQPD:
    case I_VCMPNLE_UQPD:
    case I_VCMPORD_SPD:
    case I_VCMPEQ_USPD:
    case I_VCMPNGE_UQPD:
    case I_VCMPNGT_UQPD:
    case I_VCMPFALSE_OSPD:
    case I_VCMPNEQ_OSPD:
    case I_VCMPGE_OQPD:
    case I_VCMPGT_OQPD:
    case I_VCMPTRUE_USPD:
    /* CMPPS */
    case I_CMPEQPS:
    case I_CMPLTPS:
    case I_CMPLEPS:
    case I_CMPUNORDPS:
    case I_CMPNEQPS:
    case I_CMPNLTPS:
    case I_CMPNLEPS:
    case I_CMPORDPS:
    case I_VCMPEQPS:
    case I_VCMPLTPS:
    case I_VCMPLEPS:
    case I_VCMPUNORDPS:
    case I_VCMPNEQPS:
    case I_VCMPNLTPS:
    case I_VCMPNLEPS:
    case I_VCMPORDPS:
    case I_VCMPEQ_UQPS:
    case I_VCMPNGEPS:
    case I_VCMPNGTPS:
    case I_VCMPFALSEPS:
    case I_VCMPNEQ_OQPS:
    case I_VCMPGEPS:
    case I_VCMPGTPS:
    case I_VCMPTRUEPS:
    case I_VCMPEQ_OSPS:
    case I_VCMPLT_OQPS:
    case I_VCMPLE_OQPS:
    case I_VCMPUNORD_SPS:
    case I_VCMPNEQ_USPS:
    case I_VCMPNLT_UQPS:
    case I_VCMPNLE_UQPS:
    case I_VCMPORD_SPS:
    case I_VCMPEQ_USPS:
    case I_VCMPNGE_UQPS:
    case I_VCMPNGT_UQPS:
    case I_VCMPFALSE_OSPS:
    case I_VCMPNEQ_OSPS:
    case I_VCMPGE_OQPS:
    case I_VCMPGT_OQPS:
    case I_VCMPTRUE_USPS:
    /* ohters */
    case I_PI2FD:
    case I_PI2FW:
    case I_PF2IW:
    case I_PF2ID:
    case I_PSWAPD:
    case I_VPBLENDVB:
    case I_PFNACC:
        opsiz++;
    }

    if (rel_disp->size > 0) {
        rel_disp->offset = insn->size - opsiz + disp_offset;
        funchook_log(disasm->funchook, "      ip-relative %08x, absolute address= "ADDR_FMT", offset=%d, size=%d\n",
                     (uint32_t)rel_disp->raddr, (size_t)rel_disp->addr, rel_disp->offset, rel_disp->size);
    }
    if (rel_imm->size > 0) {
        rel_imm->offset = insn->size - opsiz + imm_offset;
        funchook_log(disasm->funchook, "      ip-relative %08x, absolute address= "ADDR_FMT", offset=%d, size=%d\n",
                     (uint32_t)rel_imm->raddr, (size_t)rel_imm->addr, rel_imm->offset, rel_imm->size);
    }
}